

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void ConvertYUV444ToRGB_SSE2(__m128i *Y0,__m128i *U0,__m128i *V0,__m128i *R,__m128i *G,__m128i *B)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __m128i alVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar1 = pmulhuw((undefined1  [16])*Y0,_DAT_0013c830);
  auVar3 = pmulhuw(_DAT_0013c840,(undefined1  [16])*V0);
  auVar4._0_2_ = auVar3._0_2_ + auVar1._0_2_ + -0x379a;
  auVar4._2_2_ = auVar3._2_2_ + auVar1._2_2_ + -0x379a;
  auVar4._4_2_ = auVar3._4_2_ + auVar1._4_2_ + -0x379a;
  auVar4._6_2_ = auVar3._6_2_ + auVar1._6_2_ + -0x379a;
  auVar4._8_2_ = auVar3._8_2_ + auVar1._8_2_ + -0x379a;
  auVar4._10_2_ = auVar3._10_2_ + auVar1._10_2_ + -0x379a;
  auVar4._12_2_ = auVar3._12_2_ + auVar1._12_2_ + -0x379a;
  auVar4._14_2_ = auVar3._14_2_ + auVar1._14_2_ + -0x379a;
  auVar7 = pmulhuw(_DAT_0013c860,(undefined1  [16])*U0);
  auVar2 = pmulhuw((undefined1  [16])*V0,_DAT_0013c870);
  auVar3 = pmulhuw((undefined1  [16])*U0,_DAT_0013c890);
  auVar6 = paddusw(auVar3,auVar1);
  auVar3._0_2_ = (auVar1._0_2_ - (auVar2._0_2_ + auVar7._0_2_)) + 0x2204;
  auVar3._2_2_ = (auVar1._2_2_ - (auVar2._2_2_ + auVar7._2_2_)) + 0x2204;
  auVar3._4_2_ = (auVar1._4_2_ - (auVar2._4_2_ + auVar7._4_2_)) + 0x2204;
  auVar3._6_2_ = (auVar1._6_2_ - (auVar2._6_2_ + auVar7._6_2_)) + 0x2204;
  auVar3._8_2_ = (auVar1._8_2_ - (auVar2._8_2_ + auVar7._8_2_)) + 0x2204;
  auVar3._10_2_ = (auVar1._10_2_ - (auVar2._10_2_ + auVar7._10_2_)) + 0x2204;
  auVar3._12_2_ = (auVar1._12_2_ - (auVar2._12_2_ + auVar7._12_2_)) + 0x2204;
  auVar3._14_2_ = (auVar1._14_2_ - (auVar2._14_2_ + auVar7._14_2_)) + 0x2204;
  auVar1 = psubusw(auVar6,_DAT_0013c8a0);
  alVar5 = (__m128i)psraw(auVar4,6);
  *R = alVar5;
  alVar5 = (__m128i)psraw(auVar3,6);
  *G = alVar5;
  *(ushort *)*B = auVar1._0_2_ >> 6;
  *(ushort *)((long)*B + 2) = auVar1._2_2_ >> 6;
  *(ushort *)((long)*B + 4) = auVar1._4_2_ >> 6;
  *(ushort *)((long)*B + 6) = auVar1._6_2_ >> 6;
  *(ushort *)(*B + 1) = auVar1._8_2_ >> 6;
  *(ushort *)((long)*B + 10) = auVar1._10_2_ >> 6;
  *(ushort *)((long)*B + 0xc) = auVar1._12_2_ >> 6;
  *(ushort *)((long)*B + 0xe) = auVar1._14_2_ >> 6;
  return;
}

Assistant:

static void ConvertYUV444ToRGB_SSE2(const __m128i* const Y0,
                                    const __m128i* const U0,
                                    const __m128i* const V0,
                                    __m128i* const R,
                                    __m128i* const G,
                                    __m128i* const B) {
  const __m128i k19077 = _mm_set1_epi16(19077);
  const __m128i k26149 = _mm_set1_epi16(26149);
  const __m128i k14234 = _mm_set1_epi16(14234);
  // 33050 doesn't fit in a signed short: only use this with unsigned arithmetic
  const __m128i k33050 = _mm_set1_epi16((short)33050);
  const __m128i k17685 = _mm_set1_epi16(17685);
  const __m128i k6419  = _mm_set1_epi16(6419);
  const __m128i k13320 = _mm_set1_epi16(13320);
  const __m128i k8708  = _mm_set1_epi16(8708);

  const __m128i Y1 = _mm_mulhi_epu16(*Y0, k19077);

  const __m128i R0 = _mm_mulhi_epu16(*V0, k26149);
  const __m128i R1 = _mm_sub_epi16(Y1, k14234);
  const __m128i R2 = _mm_add_epi16(R1, R0);

  const __m128i G0 = _mm_mulhi_epu16(*U0, k6419);
  const __m128i G1 = _mm_mulhi_epu16(*V0, k13320);
  const __m128i G2 = _mm_add_epi16(Y1, k8708);
  const __m128i G3 = _mm_add_epi16(G0, G1);
  const __m128i G4 = _mm_sub_epi16(G2, G3);

  // be careful with the saturated *unsigned* arithmetic here!
  const __m128i B0 = _mm_mulhi_epu16(*U0, k33050);
  const __m128i B1 = _mm_adds_epu16(B0, Y1);
  const __m128i B2 = _mm_subs_epu16(B1, k17685);

  // use logical shift for B2, which can be larger than 32767
  *R = _mm_srai_epi16(R2, 6);   // range: [-14234, 30815]
  *G = _mm_srai_epi16(G4, 6);   // range: [-10953, 27710]
  *B = _mm_srli_epi16(B2, 6);   // range: [0, 34238]
}